

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void Imf_3_2::anon_unknown_8::writeTileData
               (Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,uint64_t pixelDataSize,
               uint64_t unpackedDataSize,char *sampleCountTableData,uint64_t sampleCountTableSize)

{
  long lVar1;
  OutputStreamMutex *pOVar2;
  OStream *pOVar3;
  int iVar4;
  undefined4 extraout_var;
  uint64_t *puVar6;
  uint64_t uVar5;
  
  pOVar2 = ofd->_streamData;
  uVar5 = pOVar2->currentPosition;
  pOVar2->currentPosition = 0;
  if (uVar5 == 0) {
    iVar4 = (*pOVar2->os->_vptr_OStream[3])();
    uVar5 = CONCAT44(extraout_var,iVar4);
  }
  puVar6 = TileOffsets::operator()(&ofd->tileOffsets,dx,dy,lx,ly);
  *puVar6 = uVar5;
  if (ofd->multipart == true) {
    Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,ofd->partNumber);
  }
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,dx);
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,dy);
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,lx);
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,ly);
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,sampleCountTableSize);
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,pixelDataSize);
  Xdr::write<Imf_3_2::StreamIO,Imf_3_2::OStream>(ofd->_streamData->os,unpackedDataSize);
  pOVar3 = ofd->_streamData->os;
  (*pOVar3->_vptr_OStream[2])(pOVar3,sampleCountTableData,sampleCountTableSize & 0xffffffff);
  pOVar3 = ofd->_streamData->os;
  (*pOVar3->_vptr_OStream[2])(pOVar3,pixelData,pixelDataSize & 0xffffffff);
  lVar1 = uVar5 + pixelDataSize + sampleCountTableSize;
  pOVar2 = ofd->_streamData;
  pOVar2->currentPosition = lVar1 + 0x28;
  if (ofd->multipart == true) {
    pOVar2->currentPosition = lVar1 + 0x2c;
  }
  return;
}

Assistant:

void
writeTileData (
    DeepTiledOutputFile::Data* ofd,
    int                        dx,
    int                        dy,
    int                        lx,
    int                        ly,
    const char                 pixelData[],
    uint64_t                   pixelDataSize,
    uint64_t                   unpackedDataSize,
    const char                 sampleCountTableData[],
    uint64_t                   sampleCountTableSize)
{

    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    uint64_t currentPosition          = ofd->_streamData->currentPosition;
    ofd->_streamData->currentPosition = 0;

    if (currentPosition == 0) currentPosition = ofd->_streamData->os->tellp ();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

#ifdef DEBUG
    assert (ofd->_streamData->os->tellp () == currentPosition);
#endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write<StreamIO> (*ofd->_streamData->os, ofd->partNumber);
    }
    Xdr::write<StreamIO> (*ofd->_streamData->os, dx);
    Xdr::write<StreamIO> (*ofd->_streamData->os, dy);
    Xdr::write<StreamIO> (*ofd->_streamData->os, lx);
    Xdr::write<StreamIO> (*ofd->_streamData->os, ly);

    //
    // Write the packed size of the pixel sample count table (64 bits)
    //

    Xdr::write<StreamIO> (*ofd->_streamData->os, sampleCountTableSize);

    //
    // Write the packed and unpacked data size (64 bits each)
    //

    Xdr::write<StreamIO> (*ofd->_streamData->os, pixelDataSize);
    Xdr::write<StreamIO> (*ofd->_streamData->os, unpackedDataSize);

    //
    // Write the compressed pixel sample count table.
    //

    ofd->_streamData->os->write (
        sampleCountTableData, static_cast<int> (sampleCountTableSize));

    //
    // Write the compressed data.
    //

    ofd->_streamData->os->write (pixelData, static_cast<int> (pixelDataSize));

    //
    // Keep current position in the file so that we can avoid
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    ofd->_streamData->currentPosition =
        currentPosition + 4 * Xdr::size<int> () + // dx, dy, lx, ly,
        3 * Xdr::size<uint64_t> () +              // sampleCountTableSize,
                                                  // pixelDataSize,
                                                  // unpackedDataSize
        sampleCountTableSize + pixelDataSize;

    if (ofd->multipart)
    {
        ofd->_streamData->currentPosition += Xdr::size<int> ();
    }
}